

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

void __thiscall
QMdiSubWindowPrivate::sizeParameters(QMdiSubWindowPrivate *this,int *margin,int *minWidth)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  QStyle *pQVar3;
  long lVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QStyleOptionTitleBar opt;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  QArrayData *pQStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) ||
     (this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8,
     ((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 0x800) != 0)) {
    *margin = 0;
    *minWidth = 0;
    goto LAB_0044c6d7;
  }
  bVar1 = QWidget::isMaximized(this_00);
  if (bVar1) {
    bVar1 = drawTitleBarWhenMaximized(this);
    iVar2 = 0;
    if (bVar1) goto LAB_0044c5dc;
  }
  else {
LAB_0044c5dc:
    pQVar3 = QWidget::style(this_00);
    iVar2 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x2c,0,this_00);
  }
  *margin = iVar2;
  local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  titleBarOptions((QStyleOptionTitleBar *)local_a8,this);
  lVar4 = 0;
  iVar2 = 0;
  do {
    if (lVar4 == 0) {
      iVar2 = iVar2 + 0x1e;
    }
    else {
      pQVar3 = QWidget::style(this_00);
      auVar5 = (**(code **)(*(long *)pQVar3 + 0xd8))
                         (pQVar3,5,local_a8,*(undefined4 *)((long)SubControls + lVar4),this_00);
      if ((auVar5._0_4_ <= auVar5._8_4_) && (auVar5._4_4_ <= auVar5._12_4_)) {
        iVar2 = ((iVar2 + auVar5._8_4_) - auVar5._0_4_) + 1;
      }
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x24);
  *minWidth = iVar2;
  QIcon::~QIcon(&local_48);
  if (pQStack_60 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_60,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_a8);
LAB_0044c6d7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::sizeParameters(int *margin, int *minWidth) const
{
    Q_Q(const QMdiSubWindow);
    Qt::WindowFlags flags = q->windowFlags();
    if (!parent || flags & Qt::FramelessWindowHint) {
        *margin = 0;
        *minWidth = 0;
        return;
    }

    if (q->isMaximized() && !drawTitleBarWhenMaximized())
        *margin = 0;
    else
        *margin = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);

    QStyleOptionTitleBar opt = this->titleBarOptions();
    int tempWidth = 0;
    for (int i = 0; i < NumSubControls; ++i) {
        if (SubControls[i] == QStyle::SC_TitleBarLabel) {
            tempWidth += 30;
            continue;
        }
        QRect rect = q->style()->subControlRect(QStyle::CC_TitleBar, &opt, SubControls[i], q);
        if (!rect.isValid())
            continue;
        tempWidth += rect.width();
    }
    *minWidth = tempWidth;
}